

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmBitDxEa<(moira::Instr)31,(moira::Mode)6,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  Syntax SVar2;
  char cVar3;
  long lVar4;
  char *pcVar5;
  Ea<(moira::Mode)6,_1> dst;
  Ea<(moira::Mode)6,_1> local_24;
  
  Op<(moira::Mode)6,1>(&local_24,this,op & 7,addr);
  cVar3 = 'b';
  lVar4 = 0;
  do {
    pcVar5 = str->ptr;
    str->ptr = pcVar5 + 1;
    *pcVar5 = cVar3;
    cVar3 = "btst"[lVar4 + 1];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar5 = str->ptr;
    str->ptr = pcVar5 + 1;
    *pcVar5 = ' ';
  }
  else {
    iVar1 = (str->tab).raw;
    pcVar5 = str->ptr;
    do {
      str->ptr = pcVar5 + 1;
      *pcVar5 = ' ';
      pcVar5 = str->ptr;
    } while (pcVar5 < str->base + iVar1);
  }
  StrWriter::operator<<(str,(Dn)(op >> 9 & 7));
  pcVar5 = str->ptr;
  str->ptr = pcVar5 + 1;
  *pcVar5 = ',';
  SVar2 = str->style->syntax;
  if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
    pcVar5 = str->ptr;
    str->ptr = pcVar5 + 1;
    *pcVar5 = ' ';
  }
  StrWriter::operator<<(str,&local_24);
  return;
}

Assistant:

void
Moira::dasmBitDxEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = Dn       ( ____xxx_________(op)       );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << str.tab << src << Sep{} << dst;
}